

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
args::
MapPositional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_args::ValueReader,_args::detail::unordered_map>
::MapPositional(MapPositional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_args::ValueReader,_args::detail::unordered_map>
                *this,Group *group_,string *name_,string *help_,
               unordered_map<std::__cxx11::basic_string<char>,_MappingEnum> *map_,
               MappingEnum *defaultValue_,Options options_)

{
  MappingEnum *defaultValue__local;
  unordered_map<std::__cxx11::basic_string<char>,_MappingEnum> *map__local;
  string *help__local;
  string *name__local;
  Group *group__local;
  MapPositional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_args::ValueReader,_args::detail::unordered_map>
  *this_local;
  
  PositionalBase::PositionalBase(&this->super_PositionalBase,name_,help_,options_);
  (this->super_PositionalBase).super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&PTR__MapPositional_00367d90;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum>_>_>
  ::unordered_map(&this->map,map_);
  this->value = *defaultValue_;
  this->defaultValue = *defaultValue_;
  Group::Add(group_,(Base *)this);
  return;
}

Assistant:

MapPositional(Group &group_, const std::string &name_, const std::string &help_, const Map<K, T> &map_, const T &defaultValue_ = T(), Options options_ = {}):
                PositionalBase(name_, help_, options_), map(map_), value(defaultValue_), defaultValue(defaultValue_)
            {
                group_.Add(*this);
            }